

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void gai_ComputePatchIndexWithSkip
               (Integer ndim,Integer *lo,Integer *plo,Integer *skip,Integer *ld,Integer *idx_buf)

{
  Integer factor;
  Integer inc;
  Integer delta;
  Integer i;
  Integer *idx_buf_local;
  Integer *ld_local;
  Integer *skip_local;
  Integer *plo_local;
  Integer *lo_local;
  Integer ndim_local;
  
  *idx_buf = ((*plo - *lo) - (*plo - *lo) % *skip) / *skip;
  for (i = 0; i < ndim + -1; i = i + 1) {
    *idx_buf = ld[i] * (((plo[i + 1] - lo[i + 1]) - (plo[i + 1] - lo[i + 1]) % skip[i + 1]) /
                       skip[i + 1]) + *idx_buf;
  }
  return;
}

Assistant:

void gai_ComputePatchIndexWithSkip(Integer ndim, Integer *lo, Integer *plo,
                                   Integer *skip, Integer *ld, Integer *idx_buf)
{
  Integer i, delta, inc, factor;
  delta = plo[0] - lo[0];
  inc = delta%skip[0];
  delta -= inc;
  delta /=  skip[0];
  *idx_buf = delta;
  for (i=0; i<ndim-1; i++) {
    factor = ld[i];
    delta = plo[i+1]-lo[i+1];
    inc = delta%skip[i+1];
    delta -= inc;
    delta /=  skip[i+1];
    *idx_buf += factor*delta;
  }
}